

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_pkcs1_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *pmVar3;
  ulong uVar4;
  size_t sVar5;
  ulong __n_00;
  long lVar6;
  uchar *input;
  mbedtls_md_context_t mStackY_a8;
  void *pvStackY_90;
  mbedtls_mpi *pmStackY_88;
  size_t sStackY_80;
  uchar auStackY_78 [72];
  
  if (ctx->padding != 1) {
    if (ctx->padding == 0) {
      iVar2 = mbedtls_rsa_rsassa_pkcs1_v15_sign(ctx,f_rng,p_rng,mode,md_alg,hashlen,hash,sig);
      return iVar2;
    }
    return -0x4100;
  }
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 1) {
      return -0x4080;
    }
LAB_00110641:
    __n = ctx->len;
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar3 = mbedtls_md_info_from_type(md_alg);
      if (pmVar3 == (mbedtls_md_info_t *)0x0) goto LAB_001106d3;
      bVar1 = mbedtls_md_get_size(pmVar3);
      hashlen = (uint)bVar1;
    }
    pmVar3 = mbedtls_md_info_from_type(ctx->hash_id);
    iVar2 = -0x4080;
    if (pmVar3 != (mbedtls_md_info_t *)0x0) {
      bVar1 = mbedtls_md_get_size(pmVar3);
      __n_00 = (ulong)bVar1;
      if ((uint)bVar1 * 2 + 2 <= __n) {
        memset(sig,0,__n);
        iVar2 = (*f_rng)(p_rng,auStackY_78,__n_00);
        if (iVar2 == 0) {
          pmStackY_88 = &ctx->N;
          pvStackY_90 = p_rng;
          sStackY_80 = mbedtls_mpi_bitlen(pmStackY_88);
          lVar6 = __n - (uint)bVar1 * 2;
          sig[lVar6 + -2] = '\x01';
          memcpy(sig + lVar6 + -1,auStackY_78,__n_00);
          mbedtls_md_init(&mStackY_a8);
          iVar2 = mbedtls_md_setup(&mStackY_a8,pmVar3,0);
          if ((iVar2 == 0) && (iVar2 = mbedtls_md_starts(&mStackY_a8), iVar2 == 0)) {
            input = sig + __n_00 + lVar6 + -1;
            iVar2 = mbedtls_md_update(&mStackY_a8,input,8);
            if (((iVar2 == 0) &&
                (((iVar2 = mbedtls_md_update(&mStackY_a8,hash,(ulong)hashlen), iVar2 == 0 &&
                  (iVar2 = mbedtls_md_update(&mStackY_a8,auStackY_78,__n_00), iVar2 == 0)) &&
                 (iVar2 = mbedtls_md_finish(&mStackY_a8,input), iVar2 == 0)))) &&
               (uVar4 = (ulong)((sStackY_80 + 7 & 7) == 0),
               iVar2 = mgf_mask(sig + uVar4,(~__n_00 + __n) - uVar4,input,__n_00,&mStackY_a8),
               iVar2 == 0)) {
              sVar5 = mbedtls_mpi_bitlen(pmStackY_88);
              *sig = *sig & (byte)(0xff >> (((char)__n * '\b' + '\x01') - (char)sVar5 & 0x1fU));
              input[__n_00] = 0xbc;
              lVar6 = 0;
              do {
                auStackY_78[lVar6] = '\0';
                lVar6 = lVar6 + 1;
              } while (lVar6 != 0x40);
              mbedtls_md_free(&mStackY_a8);
              if (mode != 0) {
                iVar2 = mbedtls_rsa_private(ctx,f_rng,pvStackY_90,sig,sig);
                return iVar2;
              }
              iVar2 = mbedtls_rsa_public(ctx,sig,sig);
              return iVar2;
            }
          }
          mbedtls_md_free(&mStackY_a8);
        }
        else {
          iVar2 = iVar2 + -0x4480;
        }
      }
    }
  }
  else {
    if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_00110641;
LAB_001106d3:
    iVar2 = -0x4080;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_pkcs1_sign( mbedtls_rsa_context *ctx,
                    int (*f_rng)(void *, unsigned char *, size_t),
                    void *p_rng,
                    int mode,
                    mbedtls_md_type_t md_alg,
                    unsigned int hashlen,
                    const unsigned char *hash,
                    unsigned char *sig )
{
    switch( ctx->padding )
    {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_sign( ctx, f_rng, p_rng, mode, md_alg,
                                              hashlen, hash, sig );
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_sign( ctx, f_rng, p_rng, mode, md_alg,
                                        hashlen, hash, sig );
#endif

        default:
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }
}